

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O3

void __thiscall
QConcatenateTablesProxyModelPrivate::slotDataChanged
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *from,QModelIndex *to,
          QList<int> *roles)

{
  int iVar1;
  QObject *this_00;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  undefined1 *local_88;
  undefined1 *puStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  QModelIndex local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_columnCount;
  if (from->c < iVar1) {
    this_00 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
    local_38.ptr = (to->m).ptr;
    local_48 = *(undefined1 **)to;
    puStack_40 = (undefined1 *)to->i;
    if (iVar1 <= to->c) {
      pQVar2 = (to->m).ptr;
      if (pQVar2 == (QAbstractItemModel *)0x0) {
        local_68._0_8_ = (undefined1 *)0xffffffffffffffff;
        local_68.i = 0;
        local_68.m.ptr = (QAbstractItemModel *)0x0;
      }
      else if (to->c == iVar1 + -1) {
        local_68.m.ptr = (to->m).ptr;
        local_68._0_8_ = *(undefined8 *)to;
        local_68.i = to->i;
      }
      else {
        (*(pQVar2->super_QObject)._vptr_QObject[0xe])(&local_68,pQVar2,(ulong)(uint)to->r);
      }
      local_38.ptr = local_68.m.ptr;
      local_48 = (undefined1 *)local_68._0_8_;
      puStack_40 = (undefined1 *)local_68.i;
    }
    local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QConcatenateTablesProxyModel::mapFromSource
              (&local_68,(QConcatenateTablesProxyModel *)this_00,from);
    local_78.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QConcatenateTablesProxyModel::mapFromSource
              ((QModelIndex *)&local_88,(QConcatenateTablesProxyModel *)this_00,
               (QModelIndex *)&local_48);
    QAbstractItemModel::dataChanged
              ((QAbstractItemModel *)this_00,&local_68,(QModelIndex *)&local_88,roles);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotDataChanged(const QModelIndex &from,
                                                          const QModelIndex &to,
                                                          const QList<int> &roles)
{
    Q_Q(QConcatenateTablesProxyModel);
    Q_ASSERT(from.isValid());
    Q_ASSERT(to.isValid());
    if (from.column() >= m_columnCount)
        return;
    QModelIndex adjustedTo = to;
    if (to.column() >= m_columnCount)
        adjustedTo = to.siblingAtColumn(m_columnCount - 1);
    const QModelIndex myFrom = q->mapFromSource(from);
    Q_ASSERT(q->checkIndex(myFrom, QAbstractItemModel::CheckIndexOption::IndexIsValid));
    const QModelIndex myTo = q->mapFromSource(adjustedTo);
    Q_ASSERT(q->checkIndex(myTo, QAbstractItemModel::CheckIndexOption::IndexIsValid));
    emit q->dataChanged(myFrom, myTo, roles);
}